

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofSpring2Constraint::getInfo2
          (btGeneric6DofSpring2Constraint *this,btConstraintInfo2 *info)

{
  btTransform *transA;
  btTransform *transB;
  btRigidBody *pbVar1;
  btRigidBody *pbVar2;
  int row;
  
  pbVar1 = (this->super_btTypedConstraint).m_rbA;
  pbVar2 = (this->super_btTypedConstraint).m_rbB;
  transA = &(pbVar1->super_btCollisionObject).m_worldTransform;
  transB = &(pbVar2->super_btCollisionObject).m_worldTransform;
  row = setAngularLimits(this,info,0,transA,transB,&pbVar1->m_linearVelocity,
                         &pbVar2->m_linearVelocity,&pbVar1->m_angularVelocity,
                         &pbVar2->m_angularVelocity);
  setLinearLimits(this,info,row,transA,transB,&pbVar1->m_linearVelocity,&pbVar2->m_linearVelocity,
                  &pbVar1->m_angularVelocity,&pbVar2->m_angularVelocity);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::getInfo2 (btConstraintInfo2* info)
{
	const btTransform& transA = m_rbA.getCenterOfMassTransform();
	const btTransform& transB = m_rbB.getCenterOfMassTransform();
	const btVector3& linVelA = m_rbA.getLinearVelocity();
	const btVector3& linVelB = m_rbB.getLinearVelocity();
	const btVector3& angVelA = m_rbA.getAngularVelocity();
	const btVector3& angVelB = m_rbB.getAngularVelocity();

	// for stability better to solve angular limits first
	int row = setAngularLimits(info, 0,transA,transB,linVelA,linVelB,angVelA,angVelB);
	setLinearLimits(info, row, transA,transB,linVelA,linVelB,angVelA,angVelB);
}